

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionReport.h
# Opt level: O2

void __thiscall
FIX43::ExecutionReport::ExecutionReport
          (ExecutionReport *this,OrderID *aOrderID,ExecID *aExecID,ExecType *aExecType,
          OrdStatus *aOrdStatus,Side *aSide,LeavesQty *aLeavesQty,CumQty *aCumQty,AvgPx *aAvgPx)

{
  FieldBase local_88;
  
  MsgType();
  Message::Message(&this->super_Message,(MsgType *)&local_88);
  FIX::FieldBase::~FieldBase(&local_88);
  *(undefined ***)&this->super_Message = &PTR__Message_00150228;
  set(this,aOrderID);
  set(this,aExecID);
  set(this,aExecType);
  set(this,aOrdStatus);
  set(this,aSide);
  set(this,aLeavesQty);
  set(this,aCumQty);
  set(this,aAvgPx);
  return;
}

Assistant:

ExecutionReport(
      const FIX::OrderID& aOrderID,
      const FIX::ExecID& aExecID,
      const FIX::ExecType& aExecType,
      const FIX::OrdStatus& aOrdStatus,
      const FIX::Side& aSide,
      const FIX::LeavesQty& aLeavesQty,
      const FIX::CumQty& aCumQty,
      const FIX::AvgPx& aAvgPx )
    : Message(MsgType())
    {
      set(aOrderID);
      set(aExecID);
      set(aExecType);
      set(aOrdStatus);
      set(aSide);
      set(aLeavesQty);
      set(aCumQty);
      set(aAvgPx);
    }